

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.cpp
# Opt level: O1

bool __thiscall DiskTableNode::hasKey(DiskTableNode *this,longlong key)

{
  IndexMap *pIVar1;
  _Base_ptr p_Var2;
  bool bVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  
  if ((this->index == (IndexMap *)0x0) ||
     ((this->index->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0)) {
    loadIndexFilter(this);
  }
  pIVar1 = this->index;
  bVar3 = mightIn(this,key);
  if (bVar3) {
    p_Var4 = &(this->index->_M_t)._M_impl.super__Rb_tree_header._M_header;
    p_Var5 = p_Var4;
    for (p_Var2 = (this->index->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[*(long *)(p_Var2 + 1) < key]) {
      if (key <= *(long *)(p_Var2 + 1)) {
        p_Var5 = p_Var2;
      }
    }
    if ((p_Var5 != p_Var4) && (*(long *)(p_Var5 + 1) <= key)) {
      p_Var4 = p_Var5;
    }
    bVar3 = (_Rb_tree_header *)p_Var4 != &(pIVar1->_M_t)._M_impl.super__Rb_tree_header;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool DiskTableNode::hasKey(long long key) {
    auto *i = getIndex();
    return mightIn(key) && index->find(key) != i->end();
}